

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::ViewPortTestCase::test(ViewPortTestCase *this)

{
  StateVerifier *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  deUint32 dVar6;
  RenderTarget *pRVar7;
  _func_int **pp_Var8;
  uint uVar9;
  TestContext *pTVar10;
  uint uVar11;
  uint y;
  uint width;
  uint uVar12;
  uint height;
  int iVar13;
  float fVar14;
  GLfloat viewportBoundsRange [2];
  GLint maxViewportDimensions [2];
  Random rnd;
  float local_68 [3];
  float local_5c;
  CallLogWrapper *local_58;
  int local_50 [2];
  TestContext *local_48;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabcdef);
  local_50[0] = 0;
  local_50[1] = 0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_58 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(local_58,0xd3a,local_50);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_viewport_array");
  if (!bVar5) {
    bVar5 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_NV_viewport_array");
    if (!bVar5) {
      bVar5 = false;
      goto LAB_01223452;
    }
  }
  glu::CallLogWrapper::glGetFloatv(local_58,0x825d,local_68);
  bVar5 = true;
LAB_01223452:
  pSVar1 = this->m_verifier;
  pTVar10 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar7 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar9 = pRVar7->m_width;
  pRVar7 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  (*pSVar1->_vptr_StateVerifier[3])(pSVar1,pTVar10,0xba2,0,0,(ulong)uVar9,pRVar7->m_height);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar13 = 0x78;
  do {
    dVar6 = deRandom_getUint32(&local_40);
    uVar9 = dVar6 % 0x1f401 - 64000;
    dVar6 = deRandom_getUint32(&local_40);
    y = dVar6 % 0x1f401 - 64000;
    iVar4 = local_50[0];
    dVar6 = deRandom_getUint32(&local_40);
    width = dVar6 % (iVar4 + 1U);
    iVar4 = local_50[1];
    dVar6 = deRandom_getUint32(&local_40);
    height = dVar6 % (iVar4 + 1U);
    glu::CallLogWrapper::glViewport(local_58,uVar9,y,width,height);
    pTVar10 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pSVar1 = this->m_verifier;
    if (bVar5) {
      local_5c = local_68[1];
      local_48 = pTVar10;
      fVar14 = floorf(local_68[0]);
      uVar12 = (uint)fVar14;
      fVar14 = floorf(local_5c);
      uVar11 = (uint)fVar14;
      uVar3 = uVar11;
      if ((int)uVar9 < (int)uVar11) {
        uVar3 = uVar9;
      }
      bVar2 = (int)uVar9 < (int)uVar12;
      uVar9 = uVar3;
      if (bVar2) {
        uVar9 = uVar12;
      }
      if ((int)y < (int)uVar11) {
        uVar11 = y;
      }
      bVar2 = (int)y < (int)uVar12;
      y = uVar11;
      if (bVar2) {
        y = uVar12;
      }
      pp_Var8 = pSVar1->_vptr_StateVerifier;
      pTVar10 = local_48;
    }
    else {
      pp_Var8 = pSVar1->_vptr_StateVerifier;
    }
    (*pp_Var8[3])(pSVar1,pTVar10,0xba2,(ulong)uVar9,(ulong)y,(ulong)width,height);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLint maxViewportDimensions[2] = {0};
		GLfloat viewportBoundsRange[2] = {0.0f};
		GLboolean hasViewportArray = false;
		glGetIntegerv(GL_MAX_VIEWPORT_DIMS, maxViewportDimensions);
		hasViewportArray = m_context.getContextInfo().isExtensionSupported("GL_OES_viewport_array") ||
						   m_context.getContextInfo().isExtensionSupported("GL_NV_viewport_array");
		if (hasViewportArray)
		{
			glGetFloatv(GL_VIEWPORT_BOUNDS_RANGE, viewportBoundsRange);
		}

		// verify initial value of first two values
		m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint x			= rnd.getInt(-64000, 64000);
			GLint y			= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, maxViewportDimensions[0]);
			GLsizei height	= rnd.getInt(0, maxViewportDimensions[1]);

			glViewport(x, y, width, height);

			if (hasViewportArray)
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT,
										   de::clamp(x, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   de::clamp(y, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   width, height);
			}
			else
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, x, y, width, height);
			}

			expectError(GL_NO_ERROR);
		}
	}